

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intContain.c
# Opt level: O1

Aig_Man_t * Inter_ManFramesLatches(Aig_Man_t *pAig,int nFrames,Vec_Ptr_t **pvMapReg)

{
  void *pvVar1;
  uint uVar2;
  Aig_Man_t *p;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  uint uVar7;
  Aig_Obj_t *p1;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  
  if (pAig->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intContain.c"
                  ,0x74,"Aig_Man_t *Inter_ManFramesLatches(Aig_Man_t *, int, Vec_Ptr_t **)");
  }
  p = Aig_ManStart((pAig->nObjs[6] + pAig->nObjs[5]) * nFrames);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  iVar8 = (nFrames + 1) * pAig->nRegs;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < iVar8 - 1U) {
    iVar11 = iVar8;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar11;
  if (iVar11 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar11 << 3);
  }
  pVVar3->pArray = ppvVar4;
  *pvMapReg = pVVar3;
  if (0 < pAig->nRegs) {
    iVar11 = 0;
    do {
      uVar2 = pAig->nTruePis + iVar11;
      if (((int)uVar2 < 0) || (pAig->vCis->nSize <= (int)uVar2)) {
LAB_008f898d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCis->pArray[uVar2];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      pVVar3 = *pvMapReg;
      uVar2 = pVVar3->nCap;
      if (pVVar3->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          iVar8 = 0x10;
        }
        else {
          iVar8 = uVar2 * 2;
          if (iVar8 <= (int)uVar2) goto LAB_008f8736;
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
          }
          pVVar3->pArray = ppvVar4;
        }
        pVVar3->nCap = iVar8;
      }
LAB_008f8736:
      iVar8 = pVVar3->nSize;
      pVVar3->nSize = iVar8 + 1;
      pVVar3->pArray[iVar8] = pAVar5;
      iVar11 = iVar11 + 1;
    } while (iVar11 < pAig->nRegs);
  }
  if (0 < nFrames) {
    iVar11 = 0;
    do {
      if (0 < pAig->nTruePis) {
        lVar10 = 0;
        do {
          if (pAig->vCis->nSize <= lVar10) goto LAB_008f898d;
          pvVar1 = pAig->vCis->pArray[lVar10];
          pAVar5 = Aig_ObjCreateCi(p);
          *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
          lVar10 = lVar10 + 1;
        } while (lVar10 < pAig->nTruePis);
      }
      pVVar3 = pAig->vObjs;
      if (0 < pVVar3->nSize) {
        lVar10 = 0;
        do {
          pvVar1 = pVVar3->pArray[lVar10];
          if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
            if (((ulong)pvVar1 & 1) != 0) goto LAB_008f89ac;
            uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
            if (uVar6 == 0) {
              pAVar5 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar5 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
            }
            uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
            if (uVar6 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
            }
            pAVar5 = Aig_And(p,pAVar5,p1);
            *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
          }
          lVar10 = lVar10 + 1;
          pVVar3 = pAig->vObjs;
        } while (lVar10 < pVVar3->nSize);
      }
      if (0 < pAig->nRegs) {
        iVar8 = 0;
        do {
          uVar2 = pAig->nTruePos + iVar8;
          if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) goto LAB_008f898d;
          pvVar1 = pAig->vCos->pArray[uVar2];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_008f89ac:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar6 == 0) {
            uVar6 = 0;
          }
          else {
            uVar6 = (ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28);
          }
          *(ulong *)((long)pvVar1 + 0x28) = uVar6;
          iVar8 = iVar8 + 1;
        } while (iVar8 < pAig->nRegs);
      }
      if (0 < pAig->nRegs) {
        iVar8 = 0;
        do {
          uVar2 = pAig->nTruePos + iVar8;
          if (((((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) ||
              (uVar7 = pAig->nTruePis + iVar8, (int)uVar7 < 0)) || (pAig->vCis->nSize <= (int)uVar7)
             ) goto LAB_008f898d;
          pvVar1 = *(void **)((long)pAig->vCos->pArray[uVar2] + 0x28);
          *(void **)((long)pAig->vCis->pArray[uVar7] + 0x28) = pvVar1;
          pVVar3 = *pvMapReg;
          uVar2 = pVVar3->nCap;
          if (pVVar3->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
              }
              pVVar3->pArray = ppvVar4;
              iVar9 = 0x10;
            }
            else {
              iVar9 = uVar2 * 2;
              if (iVar9 <= (int)uVar2) goto LAB_008f8949;
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
              }
              pVVar3->pArray = ppvVar4;
            }
            pVVar3->nCap = iVar9;
          }
LAB_008f8949:
          iVar9 = pVVar3->nSize;
          pVVar3->nSize = iVar9 + 1;
          pVVar3->pArray[iVar9] = pvVar1;
          iVar8 = iVar8 + 1;
        } while (iVar8 < pAig->nRegs);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != nFrames);
  }
  return p;
}

Assistant:

Aig_Man_t * Inter_ManFramesLatches( Aig_Man_t * pAig, int nFrames, Vec_Ptr_t ** pvMapReg )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
    assert( Saig_ManRegNum(pAig) > 0 );
    pFrames = Aig_ManStart( Aig_ManNodeNum(pAig) * nFrames );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pFrames );
    // create variables for register outputs
    *pvMapReg = Vec_PtrAlloc( (nFrames+1) * Saig_ManRegNum(pAig) );
    Saig_ManForEachLo( pAig, pObj, i )
    {
        pObj->pData = Aig_ObjCreateCi( pFrames );
        Vec_PtrPush( *pvMapReg, pObj->pData );
    }
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // create PI nodes for this frame
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        // save register inputs
        Saig_ManForEachLi( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        // transfer to register outputs
        Saig_ManForEachLiLo(  pAig, pObjLi, pObjLo, i )
        {
            pObjLo->pData = pObjLi->pData;
            Vec_PtrPush( *pvMapReg, pObjLo->pData );
        }
    }
    return pFrames;
}